

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_NewResolution(void)

{
  double dVar1;
  double oldmin;
  
  dVar1 = min_scale_mtof;
  if ((min_scale_mtof != 0.0) || (NAN(min_scale_mtof))) {
    AM_calcMinMaxMtoF();
    scale_mtof = (scale_mtof * min_scale_mtof) / dVar1;
    scale_ftom = 1.0 / scale_mtof;
    if (min_scale_mtof <= scale_mtof) {
      if (max_scale_mtof < scale_mtof) {
        AM_maxOutWindowScale();
      }
    }
    else {
      AM_minOutWindowScale();
    }
    f_w = DCanvas::GetWidth((DCanvas *)screen);
    f_h = ST_Y;
    AM_activateNewScale();
  }
  return;
}

Assistant:

void AM_NewResolution()
{
	double oldmin = min_scale_mtof;
	
	if ( oldmin == 0 ) 
	{
		return; // [SP] Not in a game, exit!
	}	
	AM_calcMinMaxMtoF();
	scale_mtof = scale_mtof * min_scale_mtof / oldmin;
	scale_ftom = 1 / scale_mtof;
	if (scale_mtof < min_scale_mtof)
		AM_minOutWindowScale();
	else if (scale_mtof > max_scale_mtof)
		AM_maxOutWindowScale();
	f_w = screen->GetWidth();
	f_h = ST_Y;
	AM_activateNewScale();
}